

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O1

void rgbcx::bc1_find_sels4_noerr
               (color32 *pSrc_pixels,uint32_t lr,uint32_t lg,uint32_t lb,uint32_t hr,uint32_t hg,
               uint32_t hb,uint8_t *sels)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint32_t uVar16;
  int iVar17;
  int iVar18;
  undefined1 auVar19 [16];
  uint32_t block_b [4];
  uint32_t block_g [4];
  uint32_t block_r [4];
  
  bc1_get_block_colors4(block_r,block_g,block_b,lr,lg,lb,hr,hg,hb);
  uVar7 = block_r[3] - block_r[0];
  uVar8 = block_g[3] - block_g[0];
  uVar9 = block_b[3] - block_b[0];
  auVar6._4_4_ = block_r[1];
  auVar6._8_4_ = block_r[2];
  auVar6._0_4_ = block_r[0];
  auVar6._12_4_ = block_r[3];
  auVar5._4_4_ = block_g[1];
  auVar5._8_4_ = block_g[2];
  auVar5._0_4_ = block_g[0];
  auVar5._12_4_ = block_g[3];
  auVar4._4_4_ = block_b[1];
  auVar4._8_4_ = block_b[2];
  auVar4._0_4_ = block_b[0];
  auVar4._12_4_ = block_b[3];
  uVar16 = (uint32_t)block_b._4_8_;
  auVar19._4_4_ = uVar16;
  auVar19._0_4_ = uVar16;
  auVar19._8_4_ = block_b[3];
  auVar19._12_4_ = block_b[3];
  iVar17 = uVar16 * uVar9 + (uint32_t)block_g._4_8_ * uVar8 + (uint32_t)block_r._4_8_ * uVar7;
  iVar18 = (int)((auVar4._8_8_ & 0xffffffff) * (ulong)uVar9) +
           (int)((auVar5._8_8_ & 0xffffffff) * (ulong)uVar8) +
           (int)((auVar6._8_8_ & 0xffffffff) * (ulong)uVar7);
  iVar11 = block_b[0] * uVar9 + block_g[0] * uVar8 + block_r[0] * uVar7 + iVar17;
  iVar17 = iVar17 + iVar18;
  iVar18 = (int)((auVar19._8_8_ & 0xffffffff) * (ulong)uVar9) +
           block_g[3] * uVar8 + block_r[3] * uVar7 + iVar18;
  iVar1 = uVar7 * 2;
  iVar2 = uVar8 * 2;
  iVar3 = uVar9 * 2;
  uVar12 = 0xfffffffffffffffc;
  do {
    iVar14 = (uint)pSrc_pixels[uVar12 + 4].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar12 + 4].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar12 + 4].field_0.field_0.r * iVar1;
    iVar15 = (uint)pSrc_pixels[uVar12 + 5].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar12 + 5].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar12 + 5].field_0.field_0.r * iVar1;
    iVar10 = (uint)pSrc_pixels[uVar12 + 6].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar12 + 6].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar12 + 6].field_0.field_0.r * iVar1;
    iVar13 = (uint)pSrc_pixels[uVar12 + 7].field_0.field_0.b * iVar3 +
             (uint)pSrc_pixels[uVar12 + 7].field_0.field_0.g * iVar2 +
             (uint)pSrc_pixels[uVar12 + 7].field_0.field_0.r * iVar1;
    sels[uVar12 + 4] =
         "\x03\x02\x01"
         [(ulong)(iVar14 < iVar18) + (ulong)(iVar14 < iVar17) + (ulong)(iVar14 <= iVar11)];
    sels[uVar12 + 5] =
         "\x03\x02\x01"
         [(ulong)(iVar15 < iVar18) + (ulong)(iVar15 < iVar17) + (ulong)(iVar15 <= iVar11)];
    sels[uVar12 + 6] =
         "\x03\x02\x01"
         [(ulong)(iVar10 < iVar18) + (ulong)(iVar10 < iVar17) + (ulong)(iVar10 <= iVar11)];
    sels[uVar12 + 7] =
         "\x03\x02\x01"
         [(ulong)(iVar13 < iVar18) + (ulong)(iVar13 < iVar17) + (ulong)(iVar13 <= iVar11)];
    uVar12 = uVar12 + 4;
  } while (uVar12 < 0xc);
  return;
}

Assistant:

static inline void bc1_find_sels4_noerr(const color32* pSrc_pixels, uint32_t lr, uint32_t lg, uint32_t lb, uint32_t hr, uint32_t hg, uint32_t hb, uint8_t sels[16])
	{
		uint32_t block_r[4], block_g[4], block_b[4];
		bc1_get_block_colors4(block_r, block_g, block_b, lr, lg, lb, hr, hg, hb);

		int ar = block_r[3] - block_r[0], ag = block_g[3] - block_g[0], ab = block_b[3] - block_b[0];

		int dots[4];
		for (uint32_t i = 0; i < 4; i++)
			dots[i] = (int)block_r[i] * ar + (int)block_g[i] * ag + (int)block_b[i] * ab;

		int t0 = dots[0] + dots[1], t1 = dots[1] + dots[2], t2 = dots[2] + dots[3];

		ar *= 2; ag *= 2; ab *= 2;

		static const uint8_t s_sels[4] = { 3, 2, 1, 0 };

		for (uint32_t i = 0; i < 16; i += 4)
		{
			const int d0 = pSrc_pixels[i+0].r * ar + pSrc_pixels[i+0].g * ag + pSrc_pixels[i+0].b * ab;
			const int d1 = pSrc_pixels[i+1].r * ar + pSrc_pixels[i+1].g * ag + pSrc_pixels[i+1].b * ab;
			const int d2 = pSrc_pixels[i+2].r * ar + pSrc_pixels[i+2].g * ag + pSrc_pixels[i+2].b * ab;
			const int d3 = pSrc_pixels[i+3].r * ar + pSrc_pixels[i+3].g * ag + pSrc_pixels[i+3].b * ab;

			sels[i+0] = s_sels[(d0 <= t0) + (d0 < t1) + (d0 < t2)];
			sels[i+1] = s_sels[(d1 <= t0) + (d1 < t1) + (d1 < t2)];
			sels[i+2] = s_sels[(d2 <= t0) + (d2 < t1) + (d2 < t2)];
			sels[i+3] = s_sels[(d3 <= t0) + (d3 < t1) + (d3 < t2)];
		}
	}